

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateRevokeFunction_TTD(JavascriptLibrary *this,RecyclableObject *proxy)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  RuntimeFunction *this_01;
  DynamicType *type;
  Var pvVar2;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_49;
  TrackAllocData local_48;
  RuntimeFunction *local_20;
  RuntimeFunction *revoker;
  RecyclableObject *proxy_local;
  JavascriptLibrary *this_local;
  
  revoker = (RuntimeFunction *)proxy;
  proxy_local = (RecyclableObject *)this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&RuntimeFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x15c8);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_01 = (RuntimeFunction *)new<(Memory::ObjectInfoBits)1>(0x40,pRVar1,&local_49);
  type = CreateFunctionWithLengthType(this,(FunctionInfo *)Js::JavascriptProxy::EntryInfo::Revoke);
  RuntimeFunction::RuntimeFunction
            (this_01,type,(FunctionInfo *)Js::JavascriptProxy::EntryInfo::Revoke);
  local_20 = this_01;
  pvVar2 = TaggedInt::ToVarUnchecked(0);
  (*(this_01->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this_01,0xd1,pvVar2,0,0,0,0xf);
  (*(local_20->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x19])
            (local_20,0xd,revoker,8,0);
  return (RecyclableObject *)local_20;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateRevokeFunction_TTD(RecyclableObject* proxy)
    {
        RuntimeFunction* revoker = RecyclerNewEnumClass(this->scriptContext->GetRecycler(), JavascriptLibrary::EnumFunctionClass, RuntimeFunction, this->CreateFunctionWithLengthType(&JavascriptProxy::EntryInfo::Revoke), &JavascriptProxy::EntryInfo::Revoke);

        revoker->SetPropertyWithAttributes(Js::PropertyIds::length, Js::TaggedInt::ToVarUnchecked(0), PropertyNone, NULL);
        revoker->SetInternalProperty(Js::InternalPropertyIds::RevocableProxy, proxy, PropertyOperationFlags::PropertyOperation_Force, nullptr);

        return revoker;
    }